

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O0

bool icu_63::double_conversion::AdvanceToNonspace<unsigned_short_const*>
               (unsigned_short **current,unsigned_short *end)

{
  bool bVar1;
  unsigned_short *end_local;
  unsigned_short **current_local;
  
  while( true ) {
    if (*current == end) {
      return false;
    }
    bVar1 = isWhitespace((uint)**current);
    if (!bVar1) break;
    *current = *current + 1;
  }
  return true;
}

Assistant:

static inline bool AdvanceToNonspace(Iterator* current, Iterator end) {
  while (*current != end) {
    if (!isWhitespace(**current)) return true;
    ++*current;
  }
  return false;
}